

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O3

tnt_iter * tnt_iter_map(tnt_iter *i,char *data,size_t size)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  tnt_iter *ptVar6;
  byte *pbVar7;
  long lVar8;
  char **ppcVar9;
  int64_t iVar10;
  bool bVar11;
  char *local_30;
  char *tmp_data;
  
  local_30 = data;
  iVar3 = mp_check(&local_30,data + size);
  if ((((iVar3 != 0) || (size == 0 || data == (char *)0x0)) || (mp_type_hint[(byte)*data] != MP_MAP)
      ) || ((bVar11 = i == (tnt_iter *)0x0, bVar11 &&
            (i = (tnt_iter *)tnt_mem_alloc(0xa8), i == (tnt_iter *)0x0)))) {
    i = (tnt_iter *)0x0;
  }
  else {
    ptVar6 = i;
    memset(i,0,0xa8);
    i->alloc = (uint)bVar11;
    i->type = TNT_ITER_MAP;
    i->next = tnt_iter_map_next;
    i->rewind = tnt_iter_map_rewind;
    (i->data).array.data = data;
    bVar1 = *data;
    (i->data).array.first_elem = data + 1;
    if (bVar1 == 0xdf) {
      uVar4 = *(uint *)(data + 1);
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      (i->data).array.first_elem = data + 5;
    }
    else if (bVar1 == 0xde) {
      uVar2 = *(ushort *)(data + 1);
      (i->data).array.first_elem = data + 3;
      uVar4 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
    }
    else {
      if (-0x71 < (char)bVar1) {
        tnt_iter_map_cold_1();
        uVar4 = (ptVar6->data).map.cur_index + 1;
        (ptVar6->data).map.cur_index = uVar4;
        if (uVar4 < (ptVar6->data).map.pair_count) {
          pbVar7 = *(byte **)((long)&ptVar6->data + (ulong)(uVar4 != 0) * 0x20 + 8);
          (ptVar6->data).array.elem = (char *)pbVar7;
          ppcVar9 = &(ptVar6->data).array.elem_end;
          iVar10 = 1;
          do {
            bVar1 = *pbVar7;
            pbVar5 = pbVar7 + 1;
            *ppcVar9 = (char *)pbVar5;
            lVar8 = (long)""[bVar1];
            if (lVar8 < 0) {
              if (bVar1 == 0xd9) {
                pbVar5 = pbVar7 + (ulong)pbVar7[1] + 2;
                goto LAB_0010bdb4;
              }
              if ((byte)""[bVar1] < 0xe1) {
                *ppcVar9 = (char *)pbVar7;
                mp_next_slowpath(ppcVar9,iVar10);
                pbVar5 = (byte *)*ppcVar9;
                break;
              }
              iVar10 = iVar10 - lVar8;
            }
            else {
              pbVar5 = pbVar5 + lVar8;
LAB_0010bdb4:
              *ppcVar9 = (char *)pbVar5;
            }
            bVar11 = 1 < iVar10;
            pbVar7 = pbVar5;
            iVar10 = iVar10 + -1;
          } while (bVar11);
          (ptVar6->data).map.value = (char *)pbVar5;
          ppcVar9 = &(ptVar6->data).map.value_end;
          iVar10 = 1;
          do {
            bVar1 = *pbVar5;
            pbVar7 = pbVar5 + 1;
            *ppcVar9 = (char *)pbVar7;
            lVar8 = (long)""[bVar1];
            if (lVar8 < 0) {
              if (bVar1 == 0xd9) {
                pbVar5 = pbVar5 + (ulong)pbVar5[1] + 2;
                goto LAB_0010be23;
              }
              if ((byte)""[bVar1] < 0xe1) {
                *ppcVar9 = (char *)pbVar5;
                mp_next_slowpath(ppcVar9,iVar10);
                break;
              }
              iVar10 = iVar10 - lVar8;
              pbVar5 = pbVar7;
            }
            else {
              pbVar5 = pbVar7 + lVar8;
LAB_0010be23:
              *ppcVar9 = (char *)pbVar5;
            }
            bVar11 = 1 < iVar10;
            iVar10 = iVar10 + -1;
          } while (bVar11);
          ptVar6 = (tnt_iter *)0x1;
        }
        else {
          ptVar6->status = TNT_ITER_FAIL;
          ptVar6 = (tnt_iter *)0x0;
        }
        return ptVar6;
      }
      uVar4 = bVar1 & 0xf;
    }
    *(uint *)((long)&i->data + 0x30) = uVar4;
    (i->data).map.cur_index = -1;
  }
  return i;
}

Assistant:

struct tnt_iter *
tnt_iter_map(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_MAP)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_MAP;
	i->next = tnt_iter_map_next;
	i->rewind = tnt_iter_map_rewind;
	i->free = NULL;
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->data = data;
	itr->first_key = data;
	itr->pair_count = mp_decode_map(&itr->first_key);
	itr->cur_index = -1;
	return i;
}